

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_decoder.h
# Opt level: O0

int LossyDctDecoder_unRleAc
              (LossyDctDecoder *d,int *lastNonZero,uint16_t **currAcComp,uint16_t *packedAcEnd,
              uint16_t *halfZigBlock)

{
  ushort uVar1;
  uint64_t ac_count;
  int lnz;
  uint16_t val;
  uint16_t *acComp;
  int dctComp;
  uint16_t *halfZigBlock_local;
  uint16_t *packedAcEnd_local;
  uint16_t **currAcComp_local;
  int *lastNonZero_local;
  LossyDctDecoder *d_local;
  
  dctComp = 1;
  acComp = *currAcComp;
  lnz = 0;
  ac_count = 0;
  while( true ) {
    if (0x3f < dctComp) {
      d->_packedAcCount = ac_count + d->_packedAcCount;
      *lastNonZero = lnz;
      *currAcComp = acComp;
      return 0;
    }
    if (packedAcEnd <= acComp) break;
    uVar1 = *acComp;
    if (uVar1 == 0xff00) {
      dctComp = 0x40;
    }
    else if ((int)(uint)uVar1 >> 8 == 0xff) {
      dctComp = (uVar1 & 0xff) + dctComp;
    }
    else {
      lnz = dctComp;
      halfZigBlock[dctComp] = uVar1;
      dctComp = dctComp + 1;
    }
    ac_count = ac_count + 1;
    acComp = acComp + 1;
  }
  return 0x17;
}

Assistant:

exr_result_t
LossyDctDecoder_unRleAc (
    LossyDctDecoder* d,
    int*             lastNonZero,
    uint16_t**       currAcComp,
    uint16_t*        packedAcEnd,
    uint16_t*        halfZigBlock)
{
    //
    // Un-RLE the RLE'd blocks. If we find an item whose
    // high byte is 0xff, then insert the number of 0's
    // as indicated by the low byte.
    //
    // Otherwise, just copy the number verbatim.
    //
    int       dctComp = 1;
    uint16_t* acComp  = *currAcComp;
    uint16_t  val;
    int       lnz      = 0;
    uint64_t  ac_count = 0;

    //
    // Start with a zero'ed block, so we don't have to
    // write when we hit a run symbol
    //

    while (dctComp < 64)
    {
        if (acComp >= packedAcEnd) { return EXR_ERR_CORRUPT_CHUNK; }
        val = *acComp;
        if (val == 0xff00)
        {
            //
            // End of block
            //

            dctComp = 64;
        }
        else if ((val >> 8) == 0xff)
        {
            //
            // Run detected! Insert 0's.
            //
            // Since the block has been zeroed, just advance the ptr
            //

            dctComp += val & 0xff;
        }
        else
        {
            //
            // Not a run, just copy over the value
            //
            lnz                   = dctComp;
            halfZigBlock[dctComp] = val;

            dctComp++;
        }

        ac_count++;
        acComp++;
    }

    d->_packedAcCount += ac_count;
    *lastNonZero = lnz;
    *currAcComp  = acComp;
    return EXR_ERR_SUCCESS;
}